

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.hpp
# Opt level: O0

AtomicRMWInst * LLVMBC::cast<LLVMBC::AtomicRMWInst>(Value *value)

{
  undefined8 uVar1;
  bool bVar2;
  ValueKind kind;
  AtomicRMWInst *this;
  void *pvVar3;
  char local_1018 [8];
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  Value *value_local;
  
  this = (AtomicRMWInst *)Internal::resolve_proxy(value);
  kind = Value::get_value_kind((Value *)this);
  bVar2 = AtomicRMWInst::is_base_of_value_kind(kind);
  if (!bVar2) {
    buffer._4088_8_ = dxil_spv::get_thread_log_callback();
    if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
      fprintf(_stderr,"[ERROR]: Invalid type ID in cast<T>.\n");
      fflush(_stderr);
    }
    else {
      snprintf(local_1018,0x1000,"Invalid type ID in cast<T>.\n");
      uVar1 = buffer._4088_8_;
      pvVar3 = dxil_spv::get_thread_log_callback_userdata();
      (*(code *)uVar1)(pvVar3,2,local_1018);
    }
    std::terminate();
  }
  return this;
}

Assistant:

inline T *cast(Value *value)
{
	if (T::get_value_kind() != ValueKind::Proxy)
		value = Internal::resolve_proxy(value);

	if (T::is_base_of_value_kind(value->get_value_kind()))
		return static_cast<T *>(value);
	else
	{
		LOGE("Invalid type ID in cast<T>.\n");
		std::terminate();
	}
}